

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void cppcms::util::urlencode_impl<std::ostream_iterator<char,char,std::char_traits<char>>>
               (char *b,char *e,ostream_iterator<char,_char,_std::char_traits<char>_> *out)

{
  byte bVar1;
  int iVar2;
  ostream_iterator<char,_char,_std::char_traits<char>_> *poVar3;
  byte *pbVar4;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  uchar uc;
  char c;
  char *in_stack_ffffffffffffffb8;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  byte *local_8;
  
  local_8 = in_RDI;
  while (local_8 != in_RSI) {
    pbVar4 = local_8 + 1;
    bVar1 = *local_8;
    local_8 = pbVar4;
    if (((((char)bVar1 < 'a') || ('z' < (char)bVar1)) &&
        (((char)bVar1 < 'A' || ('Z' < (char)bVar1)))) &&
       (((char)bVar1 < '0' || ('9' < (char)bVar1)))) {
      iVar2 = (int)(char)bVar1;
      if (((iVar2 - 0x2dU < 2) || (iVar2 == 0x5f)) || (iVar2 == 0x7e)) {
        poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(in_RDX,0);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(poVar3);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(in_RDX,0);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(poVar3);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffffc0 =
             (ostream_iterator<char,_char,_std::char_traits<char>_> *)
             ("0123456789abcdef" + ((int)(uint)bVar1 >> 4));
        poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(in_RDX,0);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(poVar3);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(in_RDX,0);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(poVar3);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
    }
    else {
      poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(in_RDX,0);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(poVar3);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void urlencode_impl(char const *b,char const *e,Iterator out)
{
	while(b!=e){
		char c=*b++;
		if(	('a'<=c && c<='z')
			|| ('A'<=c && c<='Z')
			|| ('0'<=c && c<='9'))
		{
			*out++ = c;
		}
		else {
			switch(c) {
				case '-':
				case '_':
				case '.':
				case '~':
					*out++ = c;
					break;
				default:
				{
					static char const hex[]="0123456789abcdef";
					unsigned char uc = c;
					*out++ = '%';
					*out++ = hex[(uc >> 4) & 0xF];
					*out++ = hex[ uc & 0xF];
					
				}
			};
		}
	};
}